

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_display.cpp
# Opt level: O2

size_t __thiscall cppurses::Text_display::last_index_at(Text_display *this,size_t line)

{
  pointer pGVar1;
  pointer pGVar2;
  const_reference pvVar3;
  
  if (line + 1 <
      (ulong)((long)(this->display_state_).
                    super__Vector_base<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->display_state_).
                    super__Vector_base<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4)) {
    pvVar3 = std::
             vector<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
             ::at(&this->display_state_,line + 1);
    return pvVar3->start_index;
  }
  pGVar1 = (this->contents_).super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>.
           super__Vector_base<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>._M_impl.
           super__Vector_impl_data._M_start;
  pGVar2 = (this->contents_).super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>.
           super__Vector_base<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pGVar1 != pGVar2) {
    return ((long)pGVar2 - (long)pGVar1) / 0x18 - 1;
  }
  return 0;
}

Assistant:

std::size_t Text_display::last_index_at(std::size_t line) const {
    const auto next_line = line + 1;
    if (next_line >= display_state_.size()) {
        return this->end_index();
    }
    return display_state_.at(next_line).start_index;
}